

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O1

void __thiscall MT32Emu::TVF::reset(TVF *this,PartialParam *newPartialParam,uint basePitch)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Poly *pPVar5;
  Tables *pTVar6;
  Synth *pSVar7;
  int iVar8;
  int iVar9;
  Bit8u BVar10;
  int iVar11;
  Bit8u target;
  bool bVar12;
  
  this->partialParam = newPartialParam;
  pPVar5 = Partial::getPoly(this->partial);
  uVar2 = Poly::getKey(pPVar5);
  pPVar5 = Partial::getPoly(this->partial);
  uVar3 = Poly::getVelocity(pPVar5);
  pTVar6 = Tables::getInstance();
  pSVar7 = Partial::getSynth(this->partial);
  iVar9 = uVar2 - 0x3c;
  iVar8 = ((int)(char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                      ::keyfollowMult21[(newPartialParam->tvf).keyfollow] -
          (int)(char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                     ::keyfollowMult21[(newPartialParam->wg).pitchKeyfollow]) * iVar9;
  bVar1 = (newPartialParam->tvf).biasPoint;
  iVar11 = bVar1 - uVar2;
  if ((bVar1 & 0x40) == 0) {
    iVar11 = iVar11 + 0x21;
    if (0 < iVar11) {
      iVar8 = iVar8 - iVar11 * (char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                                     ::biasLevelToBiasMult[(newPartialParam->tvf).biasLevel];
    }
  }
  else {
    iVar11 = iVar11 + -0x1f;
    if (iVar11 < 0) {
      iVar8 = iVar8 + iVar11 * (char)calcBaseCutoff(MT32Emu::TimbreParam::PartialParam_const*,unsigned_int,unsigned_int,bool)
                                     ::biasLevelToBiasMult[(newPartialParam->tvf).biasLevel];
    }
  }
  iVar8 = (uint)(newPartialParam->tvf).cutoff * 0x10 + iVar8 + -800;
  if (iVar8 < 0) {
    if (((uint)*pSVar7->controlROMFeatures & 0x40) == 0) {
      bVar12 = SBORROW4(iVar8,-0x7ff);
      iVar11 = 0x7ff;
      iVar4 = -0x800;
    }
    else {
      bVar12 = SBORROW4(iVar8,-0x3ff);
      iVar11 = 0x3ff;
      iVar4 = -400;
    }
    if (bVar12 == iVar8 + iVar11 < 0) {
      iVar4 = iVar8;
    }
  }
  else {
    iVar4 = iVar8 + (basePitch >> 4) + -0xe00;
    iVar11 = 0;
    if (0 < iVar4) {
      iVar11 = iVar4;
    }
    iVar4 = iVar8 - iVar11;
  }
  iVar8 = iVar4 + 0x808 >> 4;
  BVar10 = (Bit8u)iVar8;
  if (0xfe < iVar8) {
    BVar10 = 0xff;
  }
  this->baseCutoff = BVar10;
  uVar2 = (uint)(newPartialParam->tvf).envVeloSensitivity;
  iVar8 = (((int)(uVar3 * uVar2) >> 6) - uVar2) +
          (iVar9 >> (4 - (newPartialParam->tvf).envDepthKeyfollow & 0x1f)) + 0x6d;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  uVar2 = (uint)(newPartialParam->tvf).envDepth * iVar8 >> 6;
  if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  this->levelMult = uVar2;
  BVar10 = (newPartialParam->tvf).envTimeKeyfollow;
  iVar9 = iVar9 >> (5 - BVar10 & 0x1f);
  if (BVar10 == '\0') {
    iVar9 = 0;
  }
  this->keyTimeSubtraction = iVar9;
  uVar2 = (newPartialParam->tvf).envLevel[0] * uVar2;
  uVar3 = (uint)(newPartialParam->tvf).envTime[0];
  iVar8 = uVar3 - iVar9;
  if (iVar8 == 0 || (int)uVar3 < iVar9) {
    BVar10 = 0xff;
  }
  else {
    iVar8 = (uint)pTVar6->envLogarithmicTime[uVar2 >> 8] - iVar8;
    iVar9 = 1;
    if (1 < iVar8) {
      iVar9 = iVar8;
    }
    BVar10 = (Bit8u)iVar9;
  }
  LA32Ramp::reset(this->cutoffModifierRamp);
  target = (Bit8u)(uVar2 >> 8);
  this->target = target;
  this->phase = 1;
  LA32Ramp::startRamp(this->cutoffModifierRamp,target,BVar10);
  return;
}

Assistant:

void TVF::reset(const TimbreParam::PartialParam *newPartialParam, unsigned int basePitch) {
	partialParam = newPartialParam;

	unsigned int key = partial->getPoly()->getKey();
	unsigned int velocity = partial->getPoly()->getVelocity();

	const Tables *tables = &Tables::getInstance();

	baseCutoff = calcBaseCutoff(newPartialParam, basePitch, key, partial->getSynth()->controlROMFeatures->quirkTVFBaseCutoffLimit);
#if MT32EMU_MONITOR_TVF >= 1
	partial->getSynth()->printDebug("[+%lu] [Partial %d] TVF,base,%d", partial->debugGetSampleNum(), partial->debugGetPartialNum(), baseCutoff);
#endif

	int newLevelMult = velocity * newPartialParam->tvf.envVeloSensitivity;
	newLevelMult >>= 6;
	newLevelMult += 109 - newPartialParam->tvf.envVeloSensitivity;
	newLevelMult += (signed(key) - 60) >> (4 - newPartialParam->tvf.envDepthKeyfollow);
	if (newLevelMult < 0) {
		newLevelMult = 0;
	}
	newLevelMult *= newPartialParam->tvf.envDepth;
	newLevelMult >>= 6;
	if (newLevelMult > 255) {
		newLevelMult = 255;
	}
	levelMult = newLevelMult;

	if (newPartialParam->tvf.envTimeKeyfollow != 0) {
		keyTimeSubtraction = (signed(key) - 60) >> (5 - newPartialParam->tvf.envTimeKeyfollow);
	} else {
		keyTimeSubtraction = 0;
	}

	int newTarget = (newLevelMult * newPartialParam->tvf.envLevel[0]) >> 8;
	int envTimeSetting = newPartialParam->tvf.envTime[0] - keyTimeSubtraction;
	int newIncrement;
	if (envTimeSetting <= 0) {
		newIncrement = (0x80 | 127);
	} else {
		newIncrement = tables->envLogarithmicTime[newTarget] - envTimeSetting;
		if (newIncrement <= 0) {
			newIncrement = 1;
		}
	}
	cutoffModifierRamp->reset();
	startRamp(newTarget, newIncrement, PHASE_2 - 1);
}